

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMeshFragment * __thiscall ON_SubDMeshFragment::FirstFaceFragment(ON_SubDMeshFragment *this)

{
  bool bVar1;
  ON_SubDMeshFragment *local_28;
  ON_SubDMeshFragment *last;
  ON_SubDMeshFragment *first;
  ON_SubDMeshFragment *this_local;
  
  bVar1 = IsFullFaceFragment(this);
  this_local = this;
  if (!bVar1) {
    bVar1 = IsFaceCornerFragment(this);
    last = this;
    if (bVar1) {
      while( true ) {
        bVar1 = false;
        if (last != (ON_SubDMeshFragment *)0x0) {
          bVar1 = last->m_face_fragment_index != 0;
        }
        if (!bVar1) break;
        last = PreviousFaceFragment(last,false);
      }
      if (last == (ON_SubDMeshFragment *)0x0) {
        this_local = (ON_SubDMeshFragment *)0x0;
      }
      else {
        local_28 = NextFaceFragment(last,false);
        while( true ) {
          bVar1 = false;
          if (local_28 != (ON_SubDMeshFragment *)0x0) {
            bVar1 = local_28->m_face_fragment_index + 1 < (uint)local_28->m_face_fragment_count;
          }
          if (!bVar1) break;
          local_28 = NextFaceFragment(local_28,false);
        }
        if (local_28 == (ON_SubDMeshFragment *)0x0) {
          this_local = (ON_SubDMeshFragment *)0x0;
        }
        else {
          this_local = last;
        }
      }
    }
    else {
      this_local = (ON_SubDMeshFragment *)0x0;
    }
  }
  return this_local;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragment::FirstFaceFragment() const
{
  if (IsFullFaceFragment())
    return this;
  if (false == IsFaceCornerFragment())
    return nullptr;

  const ON_SubDMeshFragment* first = this;
  while (nullptr != first && first->m_face_fragment_index > 0)
    first = first->PreviousFaceFragment(false);
  if (nullptr == first)
    return nullptr;
  const ON_SubDMeshFragment* last = first->NextFaceFragment(false);
  while (nullptr != last && last->m_face_fragment_index + 1 < last->m_face_fragment_count)
    last = last->NextFaceFragment(false);
  if (nullptr == last)
    return nullptr;
  return first;
}